

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O2

void __thiscall
basisu::vector<basisu::image_stats>::vector
          (vector<basisu::image_stats> *this,vector<basisu::image_stats> *other)

{
  uint32_t uVar1;
  image_stats *piVar2;
  image_stats *this_00;
  bool bVar3;
  
  this->m_p = (image_stats *)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  increase_capacity(this,other->m_size,false,false);
  uVar1 = other->m_size;
  this->m_size = uVar1;
  piVar2 = other->m_p;
  this_00 = this->m_p;
  while (bVar3 = uVar1 != 0, uVar1 = uVar1 - 1, bVar3) {
    image_stats::image_stats(this_00,piVar2);
    piVar2 = piVar2 + 1;
    this_00 = this_00 + 1;
  }
  return;
}

Assistant:

inline vector(const vector& other) :
         m_p(NULL),
         m_size(0),
         m_capacity(0)
      {
         increase_capacity(other.m_size, false);

         m_size = other.m_size;

         if (BASISU_IS_BITWISE_COPYABLE(T))
         {
             if ((m_p) && (other.m_p))
                memcpy(m_p, other.m_p, m_size * sizeof(T));
         }
         else
         {
            T* pDst = m_p;
            const T* pSrc = other.m_p;
            for (uint32_t i = m_size; i > 0; i--)
               construct(pDst++, *pSrc++);
         }
      }